

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

void __thiscall duckdb::Prefix::Append(Prefix *this,ART *art,Node other)

{
  Node *pNVar1;
  type paVar2;
  ulong uVar3;
  Prefix prefix;
  Prefix other_prefix;
  Prefix local_78;
  Prefix local_60;
  Prefix local_48;
  
  local_78.in_memory = this->in_memory;
  local_78._17_7_ = *(undefined7 *)&this->field_0x11;
  local_78.data = this->data;
  local_78.ptr = this->ptr;
  if (((ulong)other.super_IndexPointer.data & 0x7f00000000000000) == 0x100000000000000) {
    do {
      if ((long)other.super_IndexPointer.data < 0) {
        ((local_78.ptr)->super_IndexPointer).data = (idx_t)other.super_IndexPointer.data;
        return;
      }
      Prefix(&local_60,art,other,true,false);
      if (local_60.data[art->prefix_count] != '\0') {
        uVar3 = 0;
        do {
          Append(&local_48,&local_78,art,local_60.data[uVar3]);
          local_78.in_memory = local_48.in_memory;
          local_78.data = local_48.data;
          local_78.ptr = local_48.ptr;
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_60.data[art->prefix_count]);
      }
      pNVar1 = local_78.ptr;
      ((local_78.ptr)->super_IndexPointer).data = ((local_60.ptr)->super_IndexPointer).data;
      paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      FixedSizeAllocator::Free
                ((FixedSizeAllocator *)
                 paVar2->_M_elems[0].
                 super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>,
                 other.super_IndexPointer);
      other.super_IndexPointer.data = (IndexPointer)(pNVar1->super_IndexPointer).data;
    } while (((ulong)other.super_IndexPointer.data & 0x7f00000000000000) == 0x100000000000000);
  }
  return;
}

Assistant:

void Prefix::Append(ART &art, Node other) {
	D_ASSERT(other.HasMetadata());

	Prefix prefix = *this;
	while (other.GetType() == PREFIX) {
		if (other.GetGateStatus() == GateStatus::GATE_SET) {
			*prefix.ptr = other;
			return;
		}

		Prefix other_prefix(art, other, true);
		for (idx_t i = 0; i < other_prefix.data[Count(art)]; i++) {
			prefix = prefix.Append(art, other_prefix.data[i]);
		}

		*prefix.ptr = *other_prefix.ptr;
		Node::GetAllocator(art, PREFIX).Free(other);
		other = *prefix.ptr;
	}
}